

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
vo::Image<unsigned_short>::CopyFrom(Image<unsigned_short> *this,Image<unsigned_short> *img)

{
  unsigned_short *dst;
  size_t sVar1;
  unsigned_short *src;
  size_t sVar2;
  unsigned_long uVar3;
  bool bVar4;
  unsigned_long *puVar5;
  Image<unsigned_short> *img_local;
  Image<unsigned_short> *this_local;
  
  bVar4 = IsValid(this);
  if ((bVar4) && (bVar4 = IsValid(img), bVar4)) {
    dst = this->ptr;
    sVar1 = this->pitch;
    src = img->ptr;
    sVar2 = img->pitch;
    puVar5 = std::min<unsigned_long>(&img->w,&this->w);
    uVar3 = *puVar5;
    puVar5 = std::min<unsigned_long>(&img->h,&this->h);
    PitchedCopy((char *)dst,(uint)sVar1,(char *)src,(uint)sVar2,(uint)(uVar3 << 1),(uint)*puVar5);
  }
  else {
    IsValid(img);
    IsValid(this);
  }
  return;
}

Assistant:

inline void CopyFrom(const Image<T>& img) {
    if (IsValid() && img.IsValid()) {
      PitchedCopy((char*)ptr, pitch, (char*)img.ptr, img.pitch,
                  std::min(img.w, w) * sizeof(T), std::min(img.h, h));
    } else if (img.IsValid() != IsValid()) {
    }
  }